

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSceneDeserializeInfoMSFT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  XrDeserializeSceneFragmentMSFT *pXVar6;
  XrStructureType __val;
  uint uVar7;
  char cVar8;
  bool bVar9;
  char cVar10;
  char *pcVar11;
  XrInstance pXVar12;
  invalid_argument *piVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  uint uVar18;
  string fragments_prefix;
  string next_prefix;
  string fragmentcount_prefix;
  string fragments_array_prefix;
  string type_prefix;
  string __str_1;
  ostringstream oss_fragmentCount;
  ostringstream oss_fragments_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  long *local_430;
  long local_428;
  long local_420 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  long *local_3b0;
  uint local_3a8;
  long local_3a0 [2];
  string local_390;
  undefined1 local_370 [16];
  PFN_xrEnumerateInstanceExtensionProperties local_360;
  XrGeneratedDispatchTable *local_350;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  PFN_xrDestroySession local_308;
  PFN_xrEnumerateReferenceSpaces p_Stack_300;
  PFN_xrCreateReferenceSpace local_2f8;
  PFN_xrGetReferenceSpaceBoundsRect p_Stack_2f0;
  ios_base local_2b8 [272];
  undefined1 local_1a8 [24];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  paVar1 = &local_328.field_2;
  local_328._M_dataplus._M_p = (pointer)paVar1;
  local_1a8._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_328,'\x12');
  *local_328._M_dataplus._M_p = '0';
  local_328._M_dataplus._M_p[1] = 'x';
  pcVar11 = local_328._M_dataplus._M_p + local_328._M_string_length + -1;
  lVar15 = 0;
  do {
    bVar2 = local_1a8[lVar15];
    *pcVar11 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar11[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar15 = lVar15 + 1;
    pcVar11 = pcVar11 + -2;
  } while (lVar15 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != paVar1) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d0,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_3d0);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar18 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar17 = (ulong)__val;
      uVar7 = 4;
      do {
        uVar18 = uVar7;
        uVar14 = (uint)uVar17;
        if (uVar14 < 100) {
          uVar18 = uVar18 - 2;
          goto LAB_0018f265;
        }
        if (uVar14 < 1000) {
          uVar18 = uVar18 - 1;
          goto LAB_0018f265;
        }
        if (uVar14 < 10000) goto LAB_0018f265;
        uVar17 = uVar17 / 10000;
        uVar7 = uVar18 + 4;
      } while (99999 < uVar14);
      uVar18 = uVar18 + 1;
    }
LAB_0018f265:
    local_350 = gen_dispatch_table;
    local_328._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_328,(char)uVar18 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_328._M_dataplus._M_p + (XVar3 >> 0x1f),uVar18,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_3d0,&local_328);
    gen_dispatch_table = local_350;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != paVar1) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_2f8 = (PFN_xrCreateReferenceSpace)0x0;
    p_Stack_2f0 = (PFN_xrGetReferenceSpaceBoundsRect)0x0;
    local_308 = (PFN_xrDestroySession)0x0;
    p_Stack_300 = (PFN_xrEnumerateReferenceSpaces)0x0;
    local_328.field_2._M_allocated_capacity = 0;
    local_328.field_2._8_8_ = 0;
    local_328._M_dataplus._M_p = (pointer)0x0;
    local_328._M_string_length = 0;
    p_Var5 = gen_dispatch_table->StructureTypeToString;
    pXVar12 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var5)(pXVar12,value->type,(char *)&local_328);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_3d0,(char (*) [64])&local_328);
  }
  local_430 = local_420;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_430);
  value_00 = value->next;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_370 + 0x28),local_430,local_428 + (long)local_430);
  bVar9 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,(string *)(local_370 + 0x28),contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,(ulong)(local_348.field_2._M_allocated_capacity + 1))
    ;
  }
  if (!bVar9) {
    piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar13,"Invalid Operation");
    __cxa_throw(piVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_410,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_410);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"0x",2);
  *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_328.field_2 + *(long *)(local_328._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_328);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_410,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((XrSceneDeserializeInfoMSFT *)local_1a8._0_8_ !=
      (XrSceneDeserializeInfoMSFT *)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_450,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_450);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)auStack_190 + (long)*(void **)(local_1a8._0_8_ + -0x18)) =
       *(uint *)((long)auStack_190 + (long)*(void **)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[38],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [38])"const XrDeserializeSceneFragmentMSFT*",&local_450,
             &local_3f0);
  paVar1 = &local_3f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if (value->fragmentCount != 0) {
    uVar17 = 0;
    do {
      local_3f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3f0,local_450._M_dataplus._M_p,
                 local_450._M_dataplus._M_p + local_450._M_string_length);
      std::__cxx11::string::append((char *)&local_3f0);
      cVar10 = '\x01';
      if (9 < uVar17) {
        uVar16 = uVar17;
        cVar8 = '\x04';
        do {
          cVar10 = cVar8;
          uVar18 = (uint)uVar16;
          if (uVar18 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_0018f5ac;
          }
          if (uVar18 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_0018f5ac;
          }
          if (uVar18 < 10000) goto LAB_0018f5ac;
          uVar16 = (uVar16 & 0xffffffff) / 10000;
          cVar8 = cVar10 + '\x04';
        } while (99999 < uVar18);
        cVar10 = cVar10 + '\x01';
      }
LAB_0018f5ac:
      local_3b0 = local_3a0;
      std::__cxx11::string::_M_construct((ulong)&local_3b0,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_3b0,local_3a8,(uint)uVar17);
      std::__cxx11::string::_M_append((char *)&local_3f0,(ulong)local_3b0);
      if (local_3b0 != local_3a0) {
        operator_delete(local_3b0,local_3a0[0] + 1);
      }
      std::__cxx11::string::append((char *)&local_3f0);
      pXVar6 = value->fragments;
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_390,local_3f0._M_dataplus._M_p,
                 local_3f0._M_dataplus._M_p + local_3f0._M_string_length);
      local_370._0_8_ = local_370 + 0x10;
      gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_370;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_370,"const XrDeserializeSceneFragmentMSFT*","");
      bVar9 = ApiDumpOutputXrStruct
                        (gen_dispatch_table_00,pXVar6 + uVar17,&local_390,(string *)local_370,false,
                         contents);
      if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
        operator_delete((void *)local_370._0_8_,(ulong)(local_360 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      if (!bVar9) {
        piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar13,"Invalid Operation");
        __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < value->fragmentCount);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
  std::ios_base::~ios_base(local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if (local_430 != local_420) {
    operator_delete(local_430,local_420[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSceneDeserializeInfoMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string fragmentcount_prefix = prefix;
        fragmentcount_prefix += "fragmentCount";
        std::ostringstream oss_fragmentCount;
        oss_fragmentCount << "0x" << std::hex << (value->fragmentCount);
        contents.emplace_back("uint32_t", fragmentcount_prefix, oss_fragmentCount.str());
        std::string fragments_prefix = prefix;
        fragments_prefix += "fragments";
        std::ostringstream oss_fragments_array;
        oss_fragments_array << std::hex << reinterpret_cast<const void*>(value->fragments);
        contents.emplace_back("const XrDeserializeSceneFragmentMSFT*", fragments_prefix, oss_fragments_array.str());
        for (uint32_t value_fragments_inc = 0; value_fragments_inc < value->fragmentCount; ++value_fragments_inc) {
            std::string fragments_array_prefix = fragments_prefix;
            fragments_array_prefix += "[";
            fragments_array_prefix += std::to_string(value_fragments_inc);
            fragments_array_prefix += "]";
            if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->fragments[value_fragments_inc], fragments_array_prefix, "const XrDeserializeSceneFragmentMSFT*", false, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        return true;
    } catch(...) {
    }
    return false;
}